

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O3

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,PowConstExpConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
          *prepro)

{
  double __x;
  double dVar1;
  int iVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  
  dVar12 = (c->
           super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
           ).params_._M_elems[0];
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    iVar2 = (c->
            super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
            ).args_._M_elems[0];
    if ((dVar12 != 1.0) || (NAN(dVar12))) {
      lVar5 = (long)iVar2;
      __x = *(double *)(*(long *)(this + 0x40) + lVar5 * 8);
      dVar1 = *(double *)(*(long *)(this + 0x58) + lVar5 * 8);
      dVar8 = floor(dVar12);
      dVar9 = ceil(dVar12);
      if ((0.0 <= dVar12 && dVar8 == dVar9) || (0.0 <= __x)) {
        dVar10 = pow(__x,dVar12);
        dVar11 = pow(*(double *)(*(long *)(this + 0x58) + lVar5 * 8),dVar12);
        if (0.0 <= dVar12) {
          if ((dVar8 == dVar9) && (!NAN(dVar8) && !NAN(dVar9))) {
            prepro->type_ = *(Type *)(*(long *)(this + 0xa0) + lVar5 * 4);
          }
        }
        dVar8 = floor(dVar12 * 0.5);
        dVar9 = ceil(dVar12 * 0.5);
        dVar12 = dVar10;
        if (((dVar9 == dVar8 && 0.0 < dVar1) && __x < 0.0) && (dVar12 = 0.0, dVar11 <= dVar10)) {
          dVar11 = dVar10;
        }
        uVar13 = SUB84(dVar11,0);
        uVar14 = (undefined4)((ulong)dVar11 >> 0x20);
        if (dVar12 <= dVar11) {
          uVar13 = SUB84(dVar12,0);
          uVar14 = (undefined4)((ulong)dVar12 >> 0x20);
        }
        if (dVar11 <= dVar12) {
          dVar11 = dVar12;
        }
        dVar12 = prepro->lb_;
        if ((double)CONCAT44(uVar14,uVar13) <= dVar12) {
          uVar13 = SUB84(dVar12,0);
          uVar14 = (undefined4)((ulong)dVar12 >> 0x20);
        }
        prepro->lb_ = (double)CONCAT44(uVar14,uVar13);
        if (prepro->ub_ <= dVar11) {
          dVar11 = prepro->ub_;
        }
        prepro->ub_ = dVar11;
      }
    }
    else {
      prepro->result_var_ = iVar2;
    }
  }
  else {
    uVar6 = -(ulong)(prepro->lb_ < 1.0);
    uVar7 = -(ulong)(1.0 < prepro->ub_);
    uVar4 = ~uVar7 & (ulong)prepro->ub_;
    auVar15._0_8_ = uVar6 & 0x3ff0000000000000;
    auVar15._8_8_ = uVar7 & 0x3ff0000000000000;
    auVar3._8_4_ = (int)uVar4;
    auVar3._0_8_ = ~uVar6 & (ulong)prepro->lb_;
    auVar3._12_4_ = (int)(uVar4 >> 0x20);
    prepro->lb_ = (double)SUB168(auVar15 | auVar3,0);
    prepro->ub_ = (double)SUB168(auVar15 | auVar3,8);
  }
  return;
}

Assistant:

void PreprocessConstraint(
      PowConstExpConstraint& c, PreprocessInfo& prepro) {
    auto pwr = c.GetParameters()[0];
    if (0.0==std::fabs(pwr)) {              // decidable case
      prepro.narrow_result_bounds(1.0, 1.0);
      return;
    }
    auto arg = c.GetArguments()[0];
    if (1.0==pwr) {                         // decidable case
      prepro.set_result_var(arg);
      return;
    }
    auto& m = MP_DISPATCH( GetModel() );
    bool lbx_neg = m.lb(arg)<0.0;
    bool ubx_pos = m.ub(arg)>0.0;
    bool pow_int = MPD( is_integer_value(pwr) );
    if ((!pow_int && lbx_neg)          // a is fractional, lbx<0
        || (pwr<0 && lbx_neg)) {       // a<0, lbx<=0
      // We _COULD_ PL approximate when pwr<0, pow_int, lbx<0.
      // But we leave it here (don't even narrow result).
      // Gurobi 10 does not handle a<0 && lbx<0.
    } else {
      auto lbr = std::pow(m.lb(arg), pwr),
          ubr = std::pow(m.ub(arg), pwr);
      if (pow_int && pwr>=0.0) {
        // result integer if x integer, a>=0
        prepro.set_result_type( m.var_type(arg) );
      }
      if (MPD( is_integer_value(pwr / 2.0) )) {  // a even
        if (lbx_neg && ubx_pos) {
          ubr = std::max(lbr, ubr);
          lbr = 0.0;
        }
      }  // else, monotone
      prepro.narrow_result_bounds( std::min(lbr, ubr),
                                   std::max(lbr, ubr) );
    }
  }